

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void PrecomputeFilterStrengths(VP8Decoder *dec)

{
  uint8_t uVar1;
  VP8FInfo *pVVar2;
  int local_38;
  int local_34;
  int ilevel;
  int level;
  VP8FInfo *info;
  int base_level;
  int i4x4;
  VP8FilterHeader *hdr;
  int s;
  VP8Decoder *dec_local;
  
  if (0 < dec->filter_type_) {
    for (s = 0; s < 4; s = s + 1) {
      if ((dec->segment_hdr_).use_segment_ == 0) {
        base_level = (dec->filter_hdr_).level_;
      }
      else {
        base_level = (int)(dec->segment_hdr_).filter_strength_[s];
        if ((dec->segment_hdr_).absolute_delta_ == 0) {
          base_level = (dec->filter_hdr_).level_ + base_level;
        }
      }
      for (i4x4 = 0; i4x4 < 2; i4x4 = i4x4 + 1) {
        pVVar2 = dec->fstrengths_[s] + i4x4;
        level = base_level;
        if (((dec->filter_hdr_).use_lf_delta_ != 0) &&
           (level = (dec->filter_hdr_).ref_lf_delta_[0] + base_level, i4x4 != 0)) {
          level = (dec->filter_hdr_).mode_lf_delta_[0] + level;
        }
        if (level < 0) {
          local_34 = 0;
        }
        else {
          if (level < 0x40) {
            local_38 = level;
          }
          else {
            local_38 = 0x3f;
          }
          local_34 = local_38;
        }
        if (local_34 < 1) {
          pVVar2->f_limit_ = '\0';
        }
        else {
          ilevel = local_34;
          if (0 < (dec->filter_hdr_).sharpness_) {
            if ((dec->filter_hdr_).sharpness_ < 5) {
              ilevel = local_34 >> 1;
            }
            else {
              ilevel = local_34 >> 2;
            }
            if (9 - (dec->filter_hdr_).sharpness_ < ilevel) {
              ilevel = 9 - (dec->filter_hdr_).sharpness_;
            }
          }
          if (ilevel < 1) {
            ilevel = 1;
          }
          pVVar2->f_ilevel_ = (uint8_t)ilevel;
          pVVar2->f_limit_ = (char)(local_34 << 1) + (uint8_t)ilevel;
          if (local_34 < 0x28) {
            uVar1 = 0xe < local_34;
          }
          else {
            uVar1 = '\x02';
          }
          pVVar2->hev_thresh_ = uVar1;
        }
        pVVar2->f_inner_ = (uint8_t)i4x4;
      }
    }
  }
  return;
}

Assistant:

static void PrecomputeFilterStrengths(VP8Decoder* const dec) {
  if (dec->filter_type_ > 0) {
    int s;
    const VP8FilterHeader* const hdr = &dec->filter_hdr_;
    for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
      int i4x4;
      // First, compute the initial level
      int base_level;
      if (dec->segment_hdr_.use_segment_) {
        base_level = dec->segment_hdr_.filter_strength_[s];
        if (!dec->segment_hdr_.absolute_delta_) {
          base_level += hdr->level_;
        }
      } else {
        base_level = hdr->level_;
      }
      for (i4x4 = 0; i4x4 <= 1; ++i4x4) {
        VP8FInfo* const info = &dec->fstrengths_[s][i4x4];
        int level = base_level;
        if (hdr->use_lf_delta_) {
          level += hdr->ref_lf_delta_[0];
          if (i4x4) {
            level += hdr->mode_lf_delta_[0];
          }
        }
        level = (level < 0) ? 0 : (level > 63) ? 63 : level;
        if (level > 0) {
          int ilevel = level;
          if (hdr->sharpness_ > 0) {
            if (hdr->sharpness_ > 4) {
              ilevel >>= 2;
            } else {
              ilevel >>= 1;
            }
            if (ilevel > 9 - hdr->sharpness_) {
              ilevel = 9 - hdr->sharpness_;
            }
          }
          if (ilevel < 1) ilevel = 1;
          info->f_ilevel_ = ilevel;
          info->f_limit_ = 2 * level + ilevel;
          info->hev_thresh_ = (level >= 40) ? 2 : (level >= 15) ? 1 : 0;
        } else {
          info->f_limit_ = 0;  // no filtering
        }
        info->f_inner_ = i4x4;
      }
    }
  }
}